

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.cpp
# Opt level: O0

bool get_harmonic_mean_safe(double a,double b,double *c)

{
  ostream *this;
  void *this_00;
  double *c_local;
  double b_local;
  double a_local;
  
  if ((a != -b) || (NAN(a) || NAN(-b))) {
    *c = (a * 2.0 * b) / (a + b);
    this = std::operator<<((ostream *)&std::cout,"result = ");
    this_00 = (void *)std::ostream::operator<<(this,*c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool get_harmonic_mean_safe(double a, double b, double * c) {
    if (a == -b) {
        return false;
    }

    //  pass function result via pointer param...
    *c = 2.0 * a * b / (a + b);
    std::cout << "result = " << *c << std::endl;
    return true;
}